

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void absl::ForgetSynchEvent(atomic<long> *addr,intptr_t bits,intptr_t lockbit)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  uint uVar5;
  int *v;
  bool bVar6;
  
  uVar2 = synch_event_mu;
  if ((synch_event_mu & 1) == 0) {
    synch_event_mu = synch_event_mu | 1;
    LOCK();
    UNLOCK();
  }
  if ((uVar2 & 1) != 0) {
    base_internal::SpinLock::SlowLock((SpinLock *)&synch_event_mu);
  }
  uVar3 = (long)addr % 0x407 & 0xffffffff;
  v = *(int **)(synch_event + uVar3 * 8);
  if (v == (int *)0x0) {
LAB_001491d8:
    uVar3 = (addr->super___atomic_base<long>)._M_i;
    if ((uVar3 & bits) != 0) {
      do {
        if ((uVar3 & lockbit) == 0) {
          LOCK();
          bVar6 = uVar3 == (addr->super___atomic_base<long>)._M_i;
          if (bVar6) {
            (addr->super___atomic_base<long>)._M_i = uVar3 & ~bits;
          }
          UNLOCK();
          if (bVar6) break;
        }
        uVar3 = (addr->super___atomic_base<long>)._M_i;
      } while ((uVar3 & bits) != 0);
    }
    uVar2 = synch_event_mu;
    uVar5 = synch_event_mu & 2;
    LOCK();
    UNLOCK();
    bVar6 = 7 < synch_event_mu;
    synch_event_mu = uVar5;
    if (bVar6) {
      base_internal::SpinLock::SlowUnlock((SpinLock *)&synch_event_mu,uVar2);
      return;
    }
  }
  else {
    if ((*(ulong *)(v + 4) ^ (ulong)addr) == 0xf03a5f7bf03a5f7b) {
      piVar4 = (int *)(synch_event + uVar3 * 8);
    }
    else {
      do {
        piVar4 = v;
        v = *(int **)(piVar4 + 2);
        if (v == (int *)0x0) goto LAB_001491d8;
      } while ((*(ulong *)(v + 4) ^ (ulong)addr) != 0xf03a5f7bf03a5f7b);
      piVar4 = piVar4 + 2;
    }
    *(undefined8 *)piVar4 = *(undefined8 *)(v + 2);
    iVar1 = *v;
    *v = iVar1 + -1;
    uVar3 = (addr->super___atomic_base<long>)._M_i;
    if ((uVar3 & bits) != 0) {
      do {
        if ((uVar3 & lockbit) == 0) {
          LOCK();
          bVar6 = uVar3 == (addr->super___atomic_base<long>)._M_i;
          if (bVar6) {
            (addr->super___atomic_base<long>)._M_i = uVar3 & ~bits;
          }
          UNLOCK();
          if (bVar6) break;
        }
        uVar3 = (addr->super___atomic_base<long>)._M_i;
      } while ((uVar3 & bits) != 0);
    }
    uVar2 = synch_event_mu;
    uVar5 = synch_event_mu & 2;
    LOCK();
    UNLOCK();
    bVar6 = 7 < synch_event_mu;
    synch_event_mu = uVar5;
    if (bVar6) {
      base_internal::SpinLock::SlowUnlock((SpinLock *)&synch_event_mu,uVar2);
    }
    if (iVar1 + -1 == 0) {
      base_internal::LowLevelAlloc::Free(v);
      return;
    }
  }
  return;
}

Assistant:

static void ForgetSynchEvent(std::atomic<intptr_t> *addr, intptr_t bits,
                             intptr_t lockbit) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent **pe;
  SynchEvent *e;
  synch_event_mu.Lock();
  for (pe = &synch_event[h];
       (e = *pe) != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       pe = &e->next) {
  }
  bool del = false;
  if (e != nullptr) {
    *pe = e->next;
    del = (--(e->refcount) == 0);
  }
  AtomicClearBits(addr, bits, lockbit);
  synch_event_mu.Unlock();
  if (del) {
    DeleteSynchEvent(e);
  }
}